

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debuginfo.cpp
# Opt level: O0

DebugInfo * __thiscall DebugInfo::WriteReport_abi_cxx11_(DebugInfo *this,DebugFilters *filters)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  ulong uVar4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  iterator iVar8;
  reference pTVar9;
  reference pSVar10;
  char *pcVar11;
  reference __x;
  iterator iVar12;
  iterator iVar13;
  pointer pOVar14;
  iterator iVar15;
  iterator iVar16;
  reference pOVar17;
  char *pcVar18;
  undefined8 uVar19;
  reference pCVar20;
  long in_RDX;
  int index;
  char *local_348;
  uint32_t size;
  ContribInfo *cnt;
  iterator __end1_10;
  iterator __begin1_10;
  vector<ContribInfo,_std::allocator<ContribInfo>_> *__range1_10;
  uint32_t contribDataSize;
  uint32_t contribCodeSize;
  string objFile_4;
  ObjectFileInfo *f_3;
  iterator __end1_9;
  iterator __begin1_9;
  vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> *__range1_9;
  ObjectFileInfo *f_2;
  iterator __end1_8;
  iterator __begin1_8;
  vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> *__range1_8;
  string objFile_3;
  ObjectFileInfo *f_1;
  iterator __end1_7;
  iterator __begin1_7;
  vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> *__range1_7;
  ObjectFileInfo *f;
  iterator __end1_6;
  iterator __begin1_6;
  vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> *__range1_6;
  vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> objectFiles;
  string *name;
  NamespaceInfo *n_1;
  iterator __end1_5;
  iterator __begin1_5;
  vector<NamespaceInfo,_std::allocator<NamespaceInfo>_> *__range1_5;
  NamespaceInfo *n;
  iterator __end1_4;
  iterator __begin1_4;
  vector<NamespaceInfo,_std::allocator<NamespaceInfo>_> *__range1_4;
  vector<NamespaceInfo,_std::allocator<NamespaceInfo>_> nameSpaces;
  string objFile_2;
  char *name1_3;
  SymbolInfo *sym_2;
  iterator __end1_3;
  iterator __begin1_3;
  vector<SymbolInfo,_std::allocator<SymbolInfo>_> *__range1_3;
  string objFile_1;
  char *name1_2;
  SymbolInfo *sym_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<SymbolInfo,_std::allocator<SymbolInfo>_> *__range1_2;
  char *name1_1;
  TemplateInfo *tpl;
  iterator __end1_1;
  iterator __begin1_1;
  vector<TemplateInfo,_std::allocator<TemplateInfo>_> *__range1_1;
  undefined1 local_a0 [8];
  string objFile;
  char *name1;
  SymbolInfo *sym;
  iterator __end1;
  iterator __begin1;
  vector<SymbolInfo,_std::allocator<SymbolInfo>_> *__range1;
  char *filterName;
  DebugFilters *filters_local;
  DebugInfo *this_local;
  string *Report;
  
  std::__cxx11::string::string((string *)this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    local_348 = (char *)std::__cxx11::string::c_str();
  }
  else {
    local_348 = (char *)0x0;
  }
  std::__cxx11::string::reserve((ulong)this);
  if (local_348 != (char *)0x0) {
    sAppendPrintF((string *)this,"Only including things with \'%s\' in their name/file\n\n",
                  local_348);
  }
  sAppendPrintF((string *)this,"Functions by size (kilobytes, min %.2f):\n",
                (double)*(int *)(in_RDX + 0x20) * 0.0009765625);
  iVar5 = std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>::begin
                    ((vector<SymbolInfo,_std::allocator<SymbolInfo>_> *)filters);
  iVar6 = std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>::end
                    ((vector<SymbolInfo,_std::allocator<SymbolInfo>_> *)filters);
  std::
  sort<__gnu_cxx::__normal_iterator<SymbolInfo*,std::vector<SymbolInfo,std::allocator<SymbolInfo>>>,DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__0>
            (iVar5._M_current,iVar6._M_current);
  __end1 = std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>::begin
                     ((vector<SymbolInfo,_std::allocator<SymbolInfo>_> *)filters);
  sym = (SymbolInfo *)
        std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>::end
                  ((vector<SymbolInfo,_std::allocator<SymbolInfo>_> *)filters);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<SymbolInfo_*,_std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>_>
                                *)&sym);
    index = (int)filters;
    if ((!bVar2) ||
       (pSVar10 = __gnu_cxx::
                  __normal_iterator<SymbolInfo_*,_std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>_>
                  ::operator*(&__end1), pSVar10->size < *(uint *)(in_RDX + 0x20))) break;
    if (pSVar10->sectionType == Code) {
      pcVar18 = (char *)std::__cxx11::string::c_str();
      GetObjectFileDesc_abi_cxx11_((DebugInfo *)local_a0,index);
      if ((local_348 == (char *)0x0) ||
         (pcVar11 = strstr(pcVar18,local_348), pcVar11 != (char *)0x0)) {
LAB_001035ec:
        uVar1 = pSVar10->size;
        uVar19 = std::__cxx11::string::c_str();
        sAppendPrintF((string *)this,"%5d.%02d: %-80s %s\n",(ulong)(uVar1 >> 10),
                      (ulong)((uVar1 & 0x3ff) * 100 >> 10),pcVar18,uVar19);
      }
      else {
        pcVar11 = (char *)std::__cxx11::string::c_str();
        pcVar11 = strstr(pcVar11,local_348);
        if (pcVar11 != (char *)0x0) goto LAB_001035ec;
      }
      std::__cxx11::string::~string((string *)local_a0);
    }
    __gnu_cxx::
    __normal_iterator<SymbolInfo_*,_std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>_>::
    operator++(&__end1);
  }
  sAppendPrintF((string *)this,"\nAggregated templates by size (kilobytes, min %.2f / %i):\n",
                (double)*(int *)(in_RDX + 0x30) * 0.0009765625,(ulong)*(uint *)(in_RDX + 0x34));
  iVar7 = std::vector<TemplateInfo,_std::allocator<TemplateInfo>_>::begin
                    ((vector<TemplateInfo,_std::allocator<TemplateInfo>_> *)&filters[4].field_0x10);
  iVar8 = std::vector<TemplateInfo,_std::allocator<TemplateInfo>_>::end
                    ((vector<TemplateInfo,_std::allocator<TemplateInfo>_> *)&filters[4].field_0x10);
  std::
  sort<__gnu_cxx::__normal_iterator<TemplateInfo*,std::vector<TemplateInfo,std::allocator<TemplateInfo>>>,DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__1>
            (iVar7._M_current,iVar8._M_current);
  __end1_1 = std::vector<TemplateInfo,_std::allocator<TemplateInfo>_>::begin
                       ((vector<TemplateInfo,_std::allocator<TemplateInfo>_> *)
                        &filters[4].field_0x10);
  tpl = (TemplateInfo *)
        std::vector<TemplateInfo,_std::allocator<TemplateInfo>_>::end
                  ((vector<TemplateInfo,_std::allocator<TemplateInfo>_> *)&filters[4].field_0x10);
  while ((bVar2 = __gnu_cxx::operator!=
                            (&__end1_1,
                             (__normal_iterator<TemplateInfo_*,_std::vector<TemplateInfo,_std::allocator<TemplateInfo>_>_>
                              *)&tpl), bVar2 &&
         (pTVar9 = __gnu_cxx::
                   __normal_iterator<TemplateInfo_*,_std::vector<TemplateInfo,_std::allocator<TemplateInfo>_>_>
                   ::operator*(&__end1_1), *(uint *)(in_RDX + 0x30) <= pTVar9->size))) {
    if ((*(uint *)(in_RDX + 0x34) <= pTVar9->count) &&
       ((pcVar18 = (char *)std::__cxx11::string::c_str(), local_348 == (char *)0x0 ||
        (pcVar11 = strstr(pcVar18,local_348), pcVar11 != (char *)0x0)))) {
      sAppendPrintF((string *)this,"%5d.%02d #%5d: %s\n",(ulong)(pTVar9->size >> 10),
                    (ulong)((pTVar9->size & 0x3ff) * 100 >> 10),(ulong)pTVar9->count,pcVar18);
    }
    __gnu_cxx::
    __normal_iterator<TemplateInfo_*,_std::vector<TemplateInfo,_std::allocator<TemplateInfo>_>_>::
    operator++(&__end1_1);
  }
  sAppendPrintF((string *)this,"\nData by size (kilobytes, min %.2f):\n",
                (double)*(int *)(in_RDX + 0x24) * 0.0009765625);
  __end1_2 = std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>::begin
                       ((vector<SymbolInfo,_std::allocator<SymbolInfo>_> *)filters);
  sym_1 = (SymbolInfo *)
          std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>::end
                    ((vector<SymbolInfo,_std::allocator<SymbolInfo>_> *)filters);
  while ((bVar2 = __gnu_cxx::operator!=
                            (&__end1_2,
                             (__normal_iterator<SymbolInfo_*,_std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>_>
                              *)&sym_1), bVar2 &&
         (pSVar10 = __gnu_cxx::
                    __normal_iterator<SymbolInfo_*,_std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>_>
                    ::operator*(&__end1_2), *(uint *)(in_RDX + 0x24) <= pSVar10->size))) {
    if (pSVar10->sectionType == Data) {
      pcVar18 = (char *)std::__cxx11::string::c_str();
      GetObjectFileDesc_abi_cxx11_((DebugInfo *)&__range1_3,index);
      if ((local_348 == (char *)0x0) ||
         (pcVar11 = strstr(pcVar18,local_348), pcVar11 != (char *)0x0)) {
LAB_00103966:
        uVar1 = pSVar10->size;
        uVar19 = std::__cxx11::string::c_str();
        sAppendPrintF((string *)this,"%5d.%02d: %-50s %s\n",(ulong)(uVar1 >> 10),
                      (ulong)((uVar1 & 0x3ff) * 100 >> 10),pcVar18,uVar19);
      }
      else {
        pcVar11 = (char *)std::__cxx11::string::c_str();
        pcVar11 = strstr(pcVar11,local_348);
        if (pcVar11 != (char *)0x0) goto LAB_00103966;
      }
      std::__cxx11::string::~string((string *)&__range1_3);
    }
    __gnu_cxx::
    __normal_iterator<SymbolInfo_*,_std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>_>::
    operator++(&__end1_2);
  }
  sAppendPrintF((string *)this,"\nBSS by size (kilobytes, min %.2f):\n",
                (double)*(int *)(in_RDX + 0x24) * 0.0009765625);
  __end1_3 = std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>::begin
                       ((vector<SymbolInfo,_std::allocator<SymbolInfo>_> *)filters);
  sym_2 = (SymbolInfo *)
          std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>::end
                    ((vector<SymbolInfo,_std::allocator<SymbolInfo>_> *)filters);
  while ((bVar2 = __gnu_cxx::operator!=
                            (&__end1_3,
                             (__normal_iterator<SymbolInfo_*,_std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>_>
                              *)&sym_2), bVar2 &&
         (pSVar10 = __gnu_cxx::
                    __normal_iterator<SymbolInfo_*,_std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>_>
                    ::operator*(&__end1_3), *(uint *)(in_RDX + 0x24) <= pSVar10->size))) {
    if (pSVar10->sectionType == BSS) {
      pcVar18 = (char *)std::__cxx11::string::c_str();
      GetObjectFileDesc_abi_cxx11_
                ((DebugInfo *)
                 &nameSpaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,index);
      if ((local_348 == (char *)0x0) ||
         (pcVar11 = strstr(pcVar18,local_348), pcVar11 != (char *)0x0)) {
LAB_00103b5a:
        uVar1 = pSVar10->size;
        uVar19 = std::__cxx11::string::c_str();
        sAppendPrintF((string *)this,"%5d.%02d: %-50s %s\n",(ulong)(uVar1 >> 10),
                      (ulong)((uVar1 & 0x3ff) * 100 >> 10),pcVar18,uVar19);
      }
      else {
        pcVar11 = (char *)std::__cxx11::string::c_str();
        pcVar11 = strstr(pcVar11,local_348);
        if (pcVar11 != (char *)0x0) goto LAB_00103b5a;
      }
      std::__cxx11::string::~string
                ((string *)
                 &nameSpaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    __gnu_cxx::
    __normal_iterator<SymbolInfo_*,_std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>_>::
    operator++(&__end1_3);
  }
  sAppendPrintF((string *)this,"\nClasses/Namespaces by code size (kilobytes, min %.2f):\n",
                (double)*(int *)(in_RDX + 0x28) * 0.0009765625);
  std::vector<NamespaceInfo,_std::allocator<NamespaceInfo>_>::vector
            ((vector<NamespaceInfo,_std::allocator<NamespaceInfo>_> *)&__range1_4);
  __end1_4 = std::vector<NamespaceInfo,_std::allocator<NamespaceInfo>_>::begin
                       ((vector<NamespaceInfo,_std::allocator<NamespaceInfo>_> *)
                        &filters->minTemplate);
  n = (NamespaceInfo *)
      std::vector<NamespaceInfo,_std::allocator<NamespaceInfo>_>::end
                ((vector<NamespaceInfo,_std::allocator<NamespaceInfo>_> *)&filters->minTemplate);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_4,
                            (__normal_iterator<NamespaceInfo_*,_std::vector<NamespaceInfo,_std::allocator<NamespaceInfo>_>_>
                             *)&n), bVar2) {
    __x = __gnu_cxx::
          __normal_iterator<NamespaceInfo_*,_std::vector<NamespaceInfo,_std::allocator<NamespaceInfo>_>_>
          ::operator*(&__end1_4);
    if (*(uint *)(in_RDX + 0x28) <= __x->codeSize) {
      std::vector<NamespaceInfo,_std::allocator<NamespaceInfo>_>::push_back
                ((vector<NamespaceInfo,_std::allocator<NamespaceInfo>_> *)&__range1_4,__x);
    }
    __gnu_cxx::
    __normal_iterator<NamespaceInfo_*,_std::vector<NamespaceInfo,_std::allocator<NamespaceInfo>_>_>
    ::operator++(&__end1_4);
  }
  iVar12 = std::vector<NamespaceInfo,_std::allocator<NamespaceInfo>_>::begin
                     ((vector<NamespaceInfo,_std::allocator<NamespaceInfo>_> *)&__range1_4);
  iVar13 = std::vector<NamespaceInfo,_std::allocator<NamespaceInfo>_>::end
                     ((vector<NamespaceInfo,_std::allocator<NamespaceInfo>_> *)&__range1_4);
  std::
  sort<__gnu_cxx::__normal_iterator<NamespaceInfo*,std::vector<NamespaceInfo,std::allocator<NamespaceInfo>>>,DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__2>
            (iVar12._M_current,iVar13._M_current);
  __end1_5 = std::vector<NamespaceInfo,_std::allocator<NamespaceInfo>_>::begin
                       ((vector<NamespaceInfo,_std::allocator<NamespaceInfo>_> *)&__range1_4);
  n_1 = (NamespaceInfo *)
        std::vector<NamespaceInfo,_std::allocator<NamespaceInfo>_>::end
                  ((vector<NamespaceInfo,_std::allocator<NamespaceInfo>_> *)&__range1_4);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_5,
                            (__normal_iterator<NamespaceInfo_*,_std::vector<NamespaceInfo,_std::allocator<NamespaceInfo>_>_>
                             *)&n_1), bVar2) {
    pOVar14 = (pointer)__gnu_cxx::
                       __normal_iterator<NamespaceInfo_*,_std::vector<NamespaceInfo,_std::allocator<NamespaceInfo>_>_>
                       ::operator*(&__end1_5);
    objectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pOVar14;
    if (local_348 == (char *)0x0) {
LAB_00103dde:
      uVar1 = *(uint *)&pOVar14->field_0x24;
      uVar19 = std::__cxx11::string::c_str();
      sAppendPrintF((string *)this,"%5d.%02d: %s\n",(ulong)(uVar1 >> 10),
                    (ulong)((uVar1 & 0x3ff) * 100 >> 10),uVar19);
    }
    else {
      pcVar18 = (char *)std::__cxx11::string::c_str();
      pcVar18 = strstr(pcVar18,local_348);
      if (pcVar18 != (char *)0x0) goto LAB_00103dde;
    }
    __gnu_cxx::
    __normal_iterator<NamespaceInfo_*,_std::vector<NamespaceInfo,_std::allocator<NamespaceInfo>_>_>
    ::operator++(&__end1_5);
  }
  sAppendPrintF((string *)this,"\nObject files by code size (kilobytes, min %.2f):\n",
                (double)*(int *)(in_RDX + 0x2c) * 0.0009765625);
  std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::vector
            ((vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> *)&__range1_6);
  __end1_6 = std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::begin
                       ((vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> *)
                        &filters[2].field_0x8);
  f = (ObjectFileInfo *)
      std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::end
                ((vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> *)&filters[2].field_0x8);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_6,
                            (__normal_iterator<ObjectFileInfo_*,_std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>_>
                             *)&f), bVar2) {
    pOVar17 = __gnu_cxx::
              __normal_iterator<ObjectFileInfo_*,_std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>_>
              ::operator*(&__end1_6);
    if ((*(uint *)(in_RDX + 0x2c) <= pOVar17->codeSize) ||
       (*(uint *)(in_RDX + 0x2c) <= pOVar17->contribCodeSize)) {
      std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::push_back
                ((vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> *)&__range1_6,pOVar17);
    }
    __gnu_cxx::
    __normal_iterator<ObjectFileInfo_*,_std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>_>
    ::operator++(&__end1_6);
  }
  iVar15 = std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::begin
                     ((vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> *)&__range1_6);
  iVar16 = std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::end
                     ((vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> *)&__range1_6);
  std::
  sort<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__3>
            (iVar15._M_current,iVar16._M_current);
  __end1_7 = std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::begin
                       ((vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> *)&__range1_6);
  f_1 = (ObjectFileInfo *)
        std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::end
                  ((vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> *)&__range1_6);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_7,
                            (__normal_iterator<ObjectFileInfo_*,_std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>_>
                             *)&f_1), bVar2) {
    pOVar17 = __gnu_cxx::
              __normal_iterator<ObjectFileInfo_*,_std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>_>
              ::operator*(&__end1_7);
    GetObjectFileDesc_abi_cxx11_((DebugInfo *)&__range1_8,index);
    if (local_348 == (char *)0x0) {
LAB_0010403e:
      if ((float)pOVar17->codeSize * 1.2 < (float)pOVar17->contribCodeSize) {
        uVar1 = pOVar17->contribCodeSize;
        uVar19 = std::__cxx11::string::c_str();
        sAppendPrintF((string *)this,"%5d.%02d: %s [%d.%02d with symbols]\n",(ulong)(uVar1 >> 10),
                      (ulong)((uVar1 & 0x3ff) * 100 >> 10),uVar19,(ulong)(pOVar17->codeSize >> 10),
                      (pOVar17->codeSize & 0x3ff) * 100 >> 10);
      }
      else {
        uVar1 = pOVar17->contribCodeSize;
        uVar19 = std::__cxx11::string::c_str();
        sAppendPrintF((string *)this,"%5d.%02d: %s\n",(ulong)(uVar1 >> 10),
                      (ulong)((uVar1 & 0x3ff) * 100 >> 10),uVar19);
      }
    }
    else {
      pcVar18 = (char *)std::__cxx11::string::c_str();
      pcVar18 = strstr(pcVar18,local_348);
      if (pcVar18 != (char *)0x0) goto LAB_0010403e;
    }
    std::__cxx11::string::~string((string *)&__range1_8);
    __gnu_cxx::
    __normal_iterator<ObjectFileInfo_*,_std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>_>
    ::operator++(&__end1_7);
  }
  sAppendPrintF((string *)this,"\nObject files by data size (kilobytes, min %.2f):\n",
                (double)*(int *)(in_RDX + 0x2c) * 0.0009765625);
  std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::clear
            ((vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> *)&__range1_6);
  __end1_8 = std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::begin
                       ((vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> *)
                        &filters[2].field_0x8);
  f_2 = (ObjectFileInfo *)
        std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::end
                  ((vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> *)&filters[2].field_0x8)
  ;
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_8,
                            (__normal_iterator<ObjectFileInfo_*,_std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>_>
                             *)&f_2), bVar2) {
    pOVar17 = __gnu_cxx::
              __normal_iterator<ObjectFileInfo_*,_std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>_>
              ::operator*(&__end1_8);
    if ((*(uint *)(in_RDX + 0x2c) <= pOVar17->dataSize) ||
       (*(uint *)(in_RDX + 0x2c) <= pOVar17->contribDataSize)) {
      std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::push_back
                ((vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> *)&__range1_6,pOVar17);
    }
    __gnu_cxx::
    __normal_iterator<ObjectFileInfo_*,_std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>_>
    ::operator++(&__end1_8);
  }
  iVar15 = std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::begin
                     ((vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> *)&__range1_6);
  iVar16 = std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::end
                     ((vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> *)&__range1_6);
  std::
  sort<__gnu_cxx::__normal_iterator<ObjectFileInfo*,std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>>,DebugInfo::WriteReport[abi:cxx11](DebugFilters_const&)::__4>
            (iVar15._M_current,iVar16._M_current);
  __end1_9 = std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::begin
                       ((vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> *)&__range1_6);
  f_3 = (ObjectFileInfo *)
        std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::end
                  ((vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> *)&__range1_6);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_9,
                       (__normal_iterator<ObjectFileInfo_*,_std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>_>
                        *)&f_3);
    if (!bVar2) {
      __range1_10._4_4_ = 0;
      __range1_10._0_4_ = 0;
      __end1_10 = std::vector<ContribInfo,_std::allocator<ContribInfo>_>::begin
                            ((vector<ContribInfo,_std::allocator<ContribInfo>_> *)
                             &filters->field_0x18);
      cnt = (ContribInfo *)
            std::vector<ContribInfo,_std::allocator<ContribInfo>_>::end
                      ((vector<ContribInfo,_std::allocator<ContribInfo>_> *)&filters->field_0x18);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1_10,
                                (__normal_iterator<ContribInfo_*,_std::vector<ContribInfo,_std::allocator<ContribInfo>_>_>
                                 *)&cnt), bVar2) {
        pCVar20 = __gnu_cxx::
                  __normal_iterator<ContribInfo_*,_std::vector<ContribInfo,_std::allocator<ContribInfo>_>_>
                  ::operator*(&__end1_10);
        if (pCVar20->sectionType == Code) {
          __range1_10._4_4_ = pCVar20->size + __range1_10._4_4_;
        }
        if (pCVar20->sectionType == Data) {
          __range1_10._0_4_ = pCVar20->size + (uint)__range1_10;
        }
        __gnu_cxx::
        __normal_iterator<ContribInfo_*,_std::vector<ContribInfo,_std::allocator<ContribInfo>_>_>::
        operator++(&__end1_10);
      }
      uVar3 = CountSizeInSection((DebugInfo *)filters,Code);
      sAppendPrintF((string *)this,"\nOverall code:  %5d.%02d kb (%d.%02d with symbols)\n",
                    (ulong)(__range1_10._4_4_ >> 10),
                    (ulong)((__range1_10._4_4_ & 0x3ff) * 100 >> 10),(ulong)(uVar3 >> 10),
                    (ulong)((uVar3 & 0x3ff) * 100 >> 10));
      uVar3 = CountSizeInSection((DebugInfo *)filters,Data);
      sAppendPrintF((string *)this,"Overall data:  %5d.%02d kb (%d.%02d with symbols)\n",
                    (ulong)((uint)__range1_10 >> 10),
                    (ulong)(((uint)__range1_10 & 0x3ff) * 100 >> 10),(ulong)(uVar3 >> 10),
                    (ulong)((uVar3 & 0x3ff) * 100 >> 10));
      uVar3 = CountSizeInSection((DebugInfo *)filters,BSS);
      sAppendPrintF((string *)this,"Overall BSS:   %5d.%02d kb\n",(ulong)(uVar3 >> 10),
                    (ulong)((uVar3 & 0x3ff) * 100 >> 10));
      uVar3 = CountSizeInSection((DebugInfo *)filters,Unknown);
      if (uVar3 != 0) {
        sAppendPrintF((string *)this,"Overall other: %5d.%02d kb\n",(ulong)(uVar3 >> 10),
                      (ulong)((uVar3 & 0x3ff) * 100 >> 10));
      }
      std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::~vector
                ((vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_> *)&__range1_6);
      std::vector<NamespaceInfo,_std::allocator<NamespaceInfo>_>::~vector
                ((vector<NamespaceInfo,_std::allocator<NamespaceInfo>_> *)&__range1_4);
      return this;
    }
    pOVar17 = __gnu_cxx::
              __normal_iterator<ObjectFileInfo_*,_std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>_>
              ::operator*(&__end1_9);
    GetObjectFileDesc_abi_cxx11_((DebugInfo *)&contribDataSize,index);
    if (local_348 == (char *)0x0) {
LAB_00104373:
      if ((float)pOVar17->dataSize * 1.2 < (float)pOVar17->contribDataSize) {
        uVar1 = pOVar17->contribDataSize;
        uVar19 = std::__cxx11::string::c_str();
        sAppendPrintF((string *)this,"%5d.%02d: %s [%d.%02d with symbols]\n",(ulong)(uVar1 >> 10),
                      (ulong)((uVar1 & 0x3ff) * 100 >> 10),uVar19,(ulong)(pOVar17->dataSize >> 10),
                      (pOVar17->dataSize & 0x3ff) * 100 >> 10);
      }
      else {
        uVar1 = pOVar17->contribDataSize;
        uVar19 = std::__cxx11::string::c_str();
        sAppendPrintF((string *)this,"%5d.%02d: %s\n",(ulong)(uVar1 >> 10),
                      (ulong)((uVar1 & 0x3ff) * 100 >> 10),uVar19);
      }
    }
    else {
      pcVar18 = (char *)std::__cxx11::string::c_str();
      pcVar18 = strstr(pcVar18,local_348);
      if (pcVar18 != (char *)0x0) goto LAB_00104373;
    }
    std::__cxx11::string::~string((string *)&contribDataSize);
    __gnu_cxx::
    __normal_iterator<ObjectFileInfo_*,_std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>_>
    ::operator++(&__end1_9);
  } while( true );
}

Assistant:

std::string DebugInfo::WriteReport(const DebugFilters& filters)
{
    std::string Report;
    const char* filterName = filters.name.empty() ? NULL : filters.name.c_str();

    Report.reserve(64 * 1024);
    if (filterName)
    {
        sAppendPrintF(Report, "Only including things with '%s' in their name/file\n\n", filterName);
    }

    // symbols
    sAppendPrintF(Report, "Functions by size (kilobytes, min %.2f):\n", filters.minFunction/1024.0);
    std::sort(m_Symbols.begin(), m_Symbols.end(), [](const auto& a, const auto& b) {
        if (a.size != b.size)
            return a.size > b.size;
        if (a.objectFileIndex != b.objectFileIndex)
            return a.objectFileIndex < b.objectFileIndex;
        return a.name < b.name;
    });

    for (const auto& sym : m_Symbols)
    {
        if (sym.size < filters.minFunction)
            break;
        if (sym.sectionType == SectionType::Code)
        {
            const char* name1 = sym.name.c_str();
            std::string objFile = GetObjectFileDesc(sym.objectFileIndex);
            if (filterName && !strstr(name1, filterName) && !strstr(objFile.c_str(), filterName))
                continue;
            sAppendPrintF(Report, "%5d.%02d: %-80s %s\n",
                sym.size / 1024, (sym.size % 1024) * 100 / 1024,
                name1, objFile.c_str());
        }
    }

    // templates
    sAppendPrintF(Report, "\nAggregated templates by size (kilobytes, min %.2f / %i):\n", filters.minTemplate/1024.0, filters.minTemplateCount);

    std::sort(m_Templates.begin(), m_Templates.end(), [](const auto& a, const auto& b) {
        if (a.size != b.size)
            return a.size > b.size;
        if (a.count != b.count)
            return a.count > b.count;
        return a.name < b.name;
    });

    for (const auto& tpl : m_Templates)
    {
        if (tpl.size < filters.minTemplate)
            break;
        if (tpl.count < filters.minTemplateCount)
            continue;
        const char* name1 = tpl.name.c_str();
        if (filterName && !strstr(name1, filterName))
            continue;
        sAppendPrintF(Report, "%5d.%02d #%5d: %s\n",
            tpl.size / 1024, (tpl.size % 1024) * 100 / 1024,
            tpl.count,
            name1);
    }

    sAppendPrintF(Report, "\nData by size (kilobytes, min %.2f):\n", filters.minData/1024.0);
    for (const auto& sym : m_Symbols)
    {
        if (sym.size < filters.minData)
            break;
        if (sym.sectionType == SectionType::Data)
        {
            const char* name1 = sym.name.c_str();
            std::string objFile = GetObjectFileDesc(sym.objectFileIndex);
            if (filterName && !strstr(name1, filterName) && !strstr(objFile.c_str(), filterName))
                continue;
            sAppendPrintF(Report, "%5d.%02d: %-50s %s\n",
                sym.size / 1024, (sym.size % 1024) * 100 / 1024,
                name1, objFile.c_str());
        }
    }

    sAppendPrintF(Report, "\nBSS by size (kilobytes, min %.2f):\n", filters.minData/1024.0);
    for (const auto& sym : m_Symbols)
    {
        if (sym.size < filters.minData)
            break;
        if (sym.sectionType == SectionType::BSS)
        {
            const char* name1 = sym.name.c_str();
            std::string objFile = GetObjectFileDesc(sym.objectFileIndex);
            if (filterName && !strstr(name1, filterName) && !strstr(objFile.c_str(), filterName))
                continue;
            sAppendPrintF(Report, "%5d.%02d: %-50s %s\n",
                sym.size / 1024, (sym.size % 1024) * 100 / 1024,
                name1, objFile.c_str());
        }
    }

    sAppendPrintF(Report, "\nClasses/Namespaces by code size (kilobytes, min %.2f):\n", filters.minClass/1024.0);
    std::vector<NamespaceInfo> nameSpaces;
    for (const auto& n : m_Namespaces)
    {
        if (n.codeSize >= filters.minClass)
            nameSpaces.push_back(n);
    }
    std::sort(nameSpaces.begin(), nameSpaces.end(), [](const auto& a, const auto& b)
    {
        if (a.codeSize != b.codeSize)
            return a.codeSize > b.codeSize;
        if (a.dataSize != b.dataSize)
            return a.dataSize > b.dataSize;
        return a.name < b.name;
    });
    for (const auto& n : nameSpaces)
    {
        const std::string& name = n.name;
        if (filterName && !strstr(name.c_str(), filterName))
            continue;
        sAppendPrintF(Report, "%5d.%02d: %s\n",
            n.codeSize / 1024, (n.codeSize % 1024) * 100 / 1024, name.c_str());
    }

    sAppendPrintF(Report, "\nObject files by code size (kilobytes, min %.2f):\n", filters.minFile/1024.0);
    std::vector<ObjectFileInfo> objectFiles;
    for (const auto& f : m_ObjectFiles)
    {
        if (f.codeSize >= filters.minFile || f.contribCodeSize >= filters.minFile)
            objectFiles.push_back(f);
    }
    std::sort(objectFiles.begin(), objectFiles.end(), [](const ObjectFileInfo& a, const ObjectFileInfo& b) {
        if (a.contribCodeSize != b.contribCodeSize)
            return a.contribCodeSize > b.contribCodeSize;
        if (a.codeSize != b.codeSize)
            return a.codeSize > b.codeSize;
        return a.index < b.index;
    });
    for (const auto& f : objectFiles)
    {
        std::string objFile = GetObjectFileDesc(f.index);
        if (filterName && !strstr(objFile.c_str(), filterName))
            continue;

        if (f.codeSize * 1.2f >= f.contribCodeSize)
        {
            sAppendPrintF(Report, "%5d.%02d: %s\n",
                f.contribCodeSize / 1024, (f.contribCodeSize % 1024) * 100 / 1024,
                objFile.c_str());
        }
        else
        {
            sAppendPrintF(Report, "%5d.%02d: %s [%d.%02d with symbols]\n",
                f.contribCodeSize / 1024, (f.contribCodeSize % 1024) * 100 / 1024,
                objFile.c_str(),
                f.codeSize / 1024, (f.codeSize % 1024) * 100 / 1024);
        }
    }

    sAppendPrintF(Report, "\nObject files by data size (kilobytes, min %.2f):\n", filters.minFile / 1024.0);
    objectFiles.clear();
    for (const auto& f : m_ObjectFiles)
    {
        if (f.dataSize >= filters.minFile || f.contribDataSize >= filters.minFile)
            objectFiles.push_back(f);
    }
    std::sort(objectFiles.begin(), objectFiles.end(), [](const ObjectFileInfo& a, const ObjectFileInfo& b) {
        if (a.contribDataSize != b.contribDataSize)
            return a.contribDataSize > b.contribDataSize;
        if (a.dataSize != b.dataSize)
            return a.dataSize > b.dataSize;
        return a.index < b.index;
        });
    for (const auto& f : objectFiles)
    {
        std::string objFile = GetObjectFileDesc(f.index);
        if (filterName && !strstr(objFile.c_str(), filterName))
            continue;

        if (f.dataSize * 1.2f >= f.contribDataSize)
        {
            sAppendPrintF(Report, "%5d.%02d: %s\n",
                f.contribDataSize / 1024, (f.contribDataSize % 1024) * 100 / 1024,
                objFile.c_str());
        }
        else
        {
            sAppendPrintF(Report, "%5d.%02d: %s [%d.%02d with symbols]\n",
                f.contribDataSize / 1024, (f.contribDataSize % 1024) * 100 / 1024,
                objFile.c_str(),
                f.dataSize / 1024, (f.dataSize % 1024) * 100 / 1024);
        }
    }


    uint32_t contribCodeSize = 0, contribDataSize = 0;
    for (const auto& cnt : m_Contribs)
    {
        if (cnt.sectionType == SectionType::Code)
            contribCodeSize += cnt.size;
        if (cnt.sectionType == SectionType::Data)
            contribDataSize += cnt.size;
    }

    uint32_t size;
    size = CountSizeInSection(SectionType::Code);
    sAppendPrintF(Report, "\nOverall code:  %5d.%02d kb (%d.%02d with symbols)\n", contribCodeSize / 1024, (contribCodeSize % 1024) * 100 / 1024, size / 1024, (size % 1024) * 100 / 1024);

    size = CountSizeInSection(SectionType::Data);
    sAppendPrintF(Report, "Overall data:  %5d.%02d kb (%d.%02d with symbols)\n", contribDataSize / 1024, (contribDataSize % 1024) * 100 / 1024, size / 1024, (size % 1024) * 100 / 1024);

    size = CountSizeInSection(SectionType::BSS);
    sAppendPrintF(Report, "Overall BSS:   %5d.%02d kb\n", size / 1024,
        (size % 1024) * 100 / 1024);

    size = CountSizeInSection(SectionType::Unknown);
    if (size > 0)
    {
        sAppendPrintF(Report, "Overall other: %5d.%02d kb\n", size / 1024,
            (size % 1024) * 100 / 1024);
    }

    return Report;
}